

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O0

CURLcode Curl_resolver_wait_resolv(connectdata *conn,Curl_dns_entry **entry)

{
  CURLcode CVar1;
  Curl_dns_entry **entry_local;
  connectdata *conn_local;
  
  CVar1 = thread_wait_resolv(conn,entry,true);
  return CVar1;
}

Assistant:

CURLcode Curl_resolver_wait_resolv(struct connectdata *conn,
                                   struct Curl_dns_entry **entry)
{
  return thread_wait_resolv(conn, entry, TRUE);
}